

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpoint.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *s,QPointF *p)

{
  long lVar1;
  QPointF *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  double y;
  double x;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDataStream::operator>>(in_RDI,&in_RSI->xp);
  QDataStream::operator>>(in_RDI,&in_RSI->xp);
  QPointF::setX(in_RSI,-NAN);
  QPointF::setY(in_RSI,-NAN);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &s, QPointF &p)
{
    double x, y;
    s >> x;
    s >> y;
    p.setX(qreal(x));
    p.setY(qreal(y));
    return s;
}